

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_AmrLevel.cpp
# Opt level: O2

void __thiscall amrex::AmrLevel::postCoarseTimeStep(AmrLevel *this,Real time)

{
  __uniq_ptr_data<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>,_true,_true> _Var1;
  long lVar2;
  int i;
  long lVar3;
  long lVar4;
  int lev;
  long lVar5;
  
  for (lVar5 = 0;
      lVar5 <= *(int *)&(this->parent->super_AmrCore).super_AmrMesh.super_AmrInfo.field_0x8c;
      lVar5 = lVar5 + 1) {
    _Var1.super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>._M_t.
    super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>.
    super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl =
         (this->parent->amr_level).
         super_vector<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         .
         super__Vector_base<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>,_std::allocator<std::unique_ptr<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start[lVar5]._M_t.
         super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>;
    lVar4 = 0;
    for (lVar3 = 0;
        lVar2 = *(long *)((long)_Var1.
                                super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                         0x170),
        lVar3 < (*(long *)((long)_Var1.
                                 super___uniq_ptr_impl<amrex::AmrLevel,_std::default_delete<amrex::AmrLevel>_>
                                 ._M_t.
                                 super__Tuple_impl<0UL,_amrex::AmrLevel_*,_std::default_delete<amrex::AmrLevel>_>
                                 .super__Head_base<0UL,_amrex::AmrLevel_*,_false>._M_head_impl +
                          0x178) - lVar2) / 0xe0; lVar3 = lVar3 + 1) {
      StateData::syncNewTimeLevel((StateData *)(lVar2 + lVar4),time);
      lVar4 = lVar4 + 0xe0;
    }
  }
  return;
}

Assistant:

void
AmrLevel::postCoarseTimeStep (Real time)
{
    BL_ASSERT(level == 0);
    // sync up statedata time
    for (int lev = 0; lev <= parent->finestLevel(); ++lev) {
        AmrLevel& amrlevel = parent->getLevel(lev);
        for (int i = 0; i < amrlevel.state.size(); ++i) {
            amrlevel.state[i].syncNewTimeLevel(time);
        }
    }
}